

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

wchar_t * fmt::v6::internal::
          parse_precision<wchar_t,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>>&>
                    (wchar_t *begin,wchar_t *end,
                    specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
                    *handler)

{
  error_handler *peVar1;
  type tVar2;
  wchar_t wVar3;
  int iVar4;
  error_handler *this;
  error_handler *local_20;
  precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
  local_18;
  
  local_20 = (error_handler *)(begin + 1);
  if (local_20 == (error_handler *)end) {
    wVar3 = L'\0';
  }
  else {
    wVar3 = *(wchar_t *)local_20;
  }
  if ((uint)(wVar3 + L'\xffffffd0') < 10) {
    this = (error_handler *)&local_20;
    iVar4 = parse_nonnegative_int<wchar_t,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>>&>
                      ((wchar_t **)this,end,handler);
    ((handler->
     super_specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
     ).super_specs_setter<wchar_t>.specs_)->precision = iVar4;
  }
  else {
    if (wVar3 != L'{') {
      error_handler::on_error((error_handler *)begin,"missing precision specifier");
    }
    this = (error_handler *)(begin + 2);
    local_20 = this;
    if (this != (error_handler *)end) {
      local_18.handler = handler;
      local_20 = (error_handler *)
                 parse_arg_id<wchar_t,fmt::v6::internal::precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>>&,wchar_t>>
                           ((wchar_t *)this,end,&local_18);
    }
    if ((local_20 == (error_handler *)end) ||
       (peVar1 = local_20 + 4, wVar3 = *(wchar_t *)local_20, local_20 = peVar1, wVar3 != L'}')) {
      error_handler::on_error(this,"invalid format string");
    }
  }
  tVar2 = (handler->checker_).arg_type_;
  if ((tVar2 != pointer_type) && (8 < tVar2 - named_arg_type)) {
    return (wchar_t *)local_20;
  }
  error_handler::on_error(this,"precision not allowed for this argument type");
}

Assistant:

FMT_CONSTEXPR const Char* parse_precision(const Char* begin, const Char* end,
                                          Handler&& handler) {
  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    handler.on_precision(parse_nonnegative_int(begin, end, handler));
  } else if (c == '{') {
    ++begin;
    if (begin != end) {
      begin =
          parse_arg_id(begin, end, precision_adapter<Handler, Char>(handler));
    }
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}